

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O3

void __thiscall cmComputeLinkDepends::UpdateGroupDependencies(cmComputeLinkDepends *this)

{
  EntryKind EVar1;
  size_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  _Rb_tree_node_base *p_Var6;
  cmGraphEdge *edge;
  pointer pcVar7;
  size_t index;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_68;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  size_t local_38;
  
  if ((this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_48 = (this->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_50 = (this->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (local_48 != local_50) {
      do {
        pcVar7 = (local_48->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                 super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_40 = (local_48->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                   super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        if (pcVar7 != local_40) {
          do {
            local_38 = pcVar7->Dest;
            EVar1 = (this->EntryList).
                    super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_38].Kind;
            if ((Group < EVar1) || ((0x1aU >> (EVar1 & 0x1f) & 1) == 0)) {
              for (p_Var6 = (this->GroupItems)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var6 !=
                  &(this->GroupItems)._M_t._M_impl.super__Rb_tree_header;
                  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
                _Var5 = std::
                        __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                  (p_Var6[1]._M_parent,p_Var6[1]._M_left,&local_38);
                if ((_Base_ptr)_Var5._M_current != p_Var6[1]._M_left) {
                  sVar2 = *(size_t *)(p_Var6 + 1);
                  local_68.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  local_68.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_68);
                  _Var4._M_pi = local_68.TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                  peVar3 = local_68.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  local_68.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  local_68.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  pcVar7->Dest = sVar2;
                  pcVar7->Strong = false;
                  pcVar7->Cross = false;
                  this_00 = (pcVar7->Backtrace).
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
                  (pcVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar3;
                  (pcVar7->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                  TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = _Var4._M_pi;
                  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
                  }
                  if (local_68.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_68.TopEntry.
                               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi);
                  }
                }
              }
            }
            pcVar7 = pcVar7 + 1;
          } while (pcVar7 != local_40);
        }
        local_48 = local_48 + 1;
      } while (local_48 != local_50);
    }
  }
  return;
}

Assistant:

void cmComputeLinkDepends::UpdateGroupDependencies()
{
  if (this->GroupItems.empty()) {
    return;
  }

  // Walks through all entries of the constraint graph to replace dependencies
  // over raw items by the group it belongs to, if any.
  for (auto& edgeList : this->EntryConstraintGraph) {
    for (auto& edge : edgeList) {
      size_t index = edge;
      if (this->EntryList[index].Kind == LinkEntry::Group ||
          this->EntryList[index].Kind == LinkEntry::Flag ||
          this->EntryList[index].Kind == LinkEntry::Object) {
        continue;
      }
      // search the item in the defined groups
      for (const auto& groupItems : this->GroupItems) {
        auto pos = std::find(groupItems.second.cbegin(),
                             groupItems.second.cend(), index);
        if (pos != groupItems.second.cend()) {
          // replace lib dependency by the group it belongs to
          edge = cmGraphEdge{ groupItems.first, false, false,
                              cmListFileBacktrace() };
        }
      }
    }
  }
}